

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_dimensional_inverse_fast_fourier_transform.cc
# Opt level: O2

bool __thiscall
sptk::TwoDimensionalInverseFastFourierTransform::Run
          (TwoDimensionalInverseFastFourierTransform *this,Matrix *real_part_input,
          Matrix *imag_part_input,Matrix *real_part_output,Matrix *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_03;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_04;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_05;
  int num_row;
  pointer pdVar1;
  pointer pdVar2;
  pointer ppdVar3;
  pointer ppdVar4;
  pointer pvVar5;
  void *pvVar6;
  bool bVar7;
  pointer pdVar8;
  long lVar9;
  ulong uVar10;
  pointer pdVar11;
  int iVar12;
  size_t sVar13;
  int i;
  long lVar14;
  ulong uVar15;
  size_type __new_size;
  int i_2;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (((((real_part_input->num_row_ == this->num_row_) &&
        (real_part_input->num_column_ == this->num_column_)) &&
       (imag_part_input->num_row_ == real_part_input->num_row_)) &&
      ((buffer != (Buffer *)0x0 && (imag_part_output != (Matrix *)0x0)))) &&
     ((real_part_output != (Matrix *)0x0 &&
      (imag_part_input->num_column_ == real_part_input->num_column_)))) {
    __new_size = (size_type)this->fft_length_;
    this_00 = &buffer->real_part_input_;
    if ((long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
    }
    this_01 = &buffer->imag_part_input_;
    if ((long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    }
    this_02 = &buffer->first_real_part_outputs_;
    if (((long)(buffer->first_real_part_outputs_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->first_real_part_outputs_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_02,__new_size);
    }
    this_03 = &buffer->first_imag_part_outputs_;
    if (((long)(buffer->first_imag_part_outputs_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->first_imag_part_outputs_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_03,__new_size);
    }
    this_04 = &buffer->second_real_part_outputs_;
    if (((long)(buffer->second_real_part_outputs_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->second_real_part_outputs_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_04,__new_size);
    }
    this_05 = &buffer->second_imag_part_outputs_;
    if (((long)(buffer->second_imag_part_outputs_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(buffer->second_imag_part_outputs_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18 != __new_size) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(this_05,__new_size);
    }
    iVar12 = real_part_output->num_row_;
    num_row = this->fft_length_;
    if ((iVar12 != num_row) || (real_part_output->num_column_ != iVar12)) {
      Matrix::Resize(real_part_output,num_row,num_row);
      iVar12 = this->fft_length_;
    }
    if ((imag_part_output->num_row_ != iVar12) || (imag_part_output->num_column_ != iVar12)) {
      Matrix::Resize(imag_part_output,iVar12,iVar12);
    }
    pdVar1 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar11 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_finish;
    pdVar2 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = this->num_row_;
    for (pdVar8 = pdVar1 + iVar12; pdVar8 != pdVar11; pdVar8 = pdVar8 + 1) {
      *pdVar8 = 0.0;
    }
    pdVar11 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_finish;
    for (pdVar8 = pdVar2 + iVar12; pdVar8 != pdVar11; pdVar8 = pdVar8 + 1) {
      *pdVar8 = 0.0;
    }
    lVar14 = 0;
    do {
      lVar9 = (long)this->num_column_;
      if (lVar9 <= lVar14) {
        pdVar8 = (buffer->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pdVar11 = (buffer->real_part_input_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9; pdVar11 != pdVar8;
            pdVar11 = pdVar11 + 1) {
          *pdVar11 = 0.0;
        }
        pdVar8 = (buffer->imag_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pdVar11 = (buffer->imag_part_input_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar9; pdVar11 != pdVar8;
            pdVar11 = pdVar11 + 1) {
          *pdVar11 = 0.0;
        }
        lVar14 = 0;
        do {
          uVar10 = (ulong)this->fft_length_;
          if ((long)uVar10 <= lVar14) {
            lVar14 = 1;
            for (lVar9 = 0; lVar9 < (int)uVar10; lVar9 = lVar9 + 1) {
              pvVar5 = (this_04->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pvVar6 = *(void **)((long)pvVar5 + lVar14 * 8 + -8);
              sVar13 = *(long *)((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data + lVar14 * 8) -
                       (long)pvVar6;
              if (sVar13 != 0) {
                memmove((real_part_output->index_).
                        super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9],pvVar6,sVar13);
              }
              pvVar5 = (this_05->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pvVar6 = *(void **)((long)pvVar5 + lVar14 * 8 + -8);
              sVar13 = *(long *)((long)&(pvVar5->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data + lVar14 * 8) -
                       (long)pvVar6;
              if (sVar13 != 0) {
                memmove((imag_part_output->index_).
                        super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9],pvVar6,sVar13);
              }
              uVar10 = (ulong)(uint)this->fft_length_;
              lVar14 = lVar14 + 3;
            }
            return true;
          }
          uVar10 = (ulong)(uint)this->num_column_;
          if (this->num_column_ < 1) {
            uVar10 = 0;
          }
          lVar9 = 0;
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            pdVar1[uVar15] =
                 *(double *)
                  (*(long *)((long)&(((this_02->
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data + lVar9) + lVar14 * 8);
            pdVar2[uVar15] =
                 *(double *)
                  (*(long *)((long)&(((this_03->
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data + lVar9) + lVar14 * 8);
            lVar9 = lVar9 + 0x18;
          }
          bVar7 = InverseFastFourierTransform::Run
                            (&this->inverse_fast_fourier_transform_,this_00,this_01,
                             (this_04->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar14,
                             (this_05->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar14);
          lVar14 = lVar14 + 1;
        } while (bVar7);
        return false;
      }
      ppdVar3 = (real_part_input->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppdVar4 = (imag_part_input->index_).super__Vector_base<double_*,_std::allocator<double_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar10 = (ulong)(uint)this->num_row_;
      if (this->num_row_ < 1) {
        uVar10 = 0;
      }
      for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
        pdVar1[uVar15] = ppdVar3[uVar15][lVar14];
        pdVar2[uVar15] = ppdVar4[uVar15][lVar14];
      }
      bVar7 = InverseFastFourierTransform::Run
                        (&this->inverse_fast_fourier_transform_,this_00,this_01,
                         (this_02->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar14,
                         (this_03->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar14);
      lVar14 = lVar14 + 1;
    } while (bVar7);
  }
  return false;
}

Assistant:

bool TwoDimensionalInverseFastFourierTransform::Run(
    const Matrix& real_part_input, const Matrix& imag_part_input,
    Matrix* real_part_output, Matrix* imag_part_output,
    TwoDimensionalInverseFastFourierTransform::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || real_part_input.GetNumRow() != num_row_ ||
      real_part_input.GetNumColumn() != num_column_ ||
      imag_part_input.GetNumRow() != num_row_ ||
      imag_part_input.GetNumColumn() != num_column_ ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  {
    const std::size_t size(static_cast<std::size_t>(fft_length_));
    if (buffer->real_part_input_.size() != size) {
      buffer->real_part_input_.resize(size);
    }
    if (buffer->imag_part_input_.size() != size) {
      buffer->imag_part_input_.resize(size);
    }
    if (buffer->first_real_part_outputs_.size() != size) {
      buffer->first_real_part_outputs_.resize(size);
    }
    if (buffer->first_imag_part_outputs_.size() != size) {
      buffer->first_imag_part_outputs_.resize(size);
    }
    if (buffer->second_real_part_outputs_.size() != size) {
      buffer->second_real_part_outputs_.resize(size);
    }
    if (buffer->second_imag_part_outputs_.size() != size) {
      buffer->second_imag_part_outputs_.resize(size);
    }
    if (real_part_output->GetNumRow() != fft_length_ ||
        real_part_output->GetNumColumn() != fft_length_) {
      real_part_output->Resize(fft_length_, fft_length_);
    }
    if (imag_part_output->GetNumRow() != fft_length_ ||
        imag_part_output->GetNumColumn() != fft_length_) {
      imag_part_output->Resize(fft_length_, fft_length_);
    }
  }

  double* x(&buffer->real_part_input_[0]);
  double* y(&buffer->imag_part_input_[0]);

  // First stage.
  std::fill(buffer->real_part_input_.begin() + num_row_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_row_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      x[j] = real_part_input[j][i];
      y[j] = imag_part_input[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->first_real_part_outputs_[i],
            &buffer->first_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Second stage.
  std::fill(buffer->real_part_input_.begin() + num_column_,
            buffer->real_part_input_.end(), 0.0);
  std::fill(buffer->imag_part_input_.begin() + num_column_,
            buffer->imag_part_input_.end(), 0.0);
  for (int i(0); i < fft_length_; ++i) {
    for (int j(0); j < num_column_; ++j) {
      x[j] = buffer->first_real_part_outputs_[j][i];
      y[j] = buffer->first_imag_part_outputs_[j][i];
    }
    if (!inverse_fast_fourier_transform_.Run(
            buffer->real_part_input_, buffer->imag_part_input_,
            &buffer->second_real_part_outputs_[i],
            &buffer->second_imag_part_outputs_[i])) {
      return false;
    }
  }

  // Save results.
  for (int i(0); i < fft_length_; ++i) {
    std::copy(buffer->second_real_part_outputs_[i].begin(),
              buffer->second_real_part_outputs_[i].end(),
              (*real_part_output)[i]);
    std::copy(buffer->second_imag_part_outputs_[i].begin(),
              buffer->second_imag_part_outputs_[i].end(),
              (*imag_part_output)[i]);
  }

  return true;
}